

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_table.c
# Opt level: O1

int luaopen_table(lua_State *L)

{
  lj_lib_register(L,"table",lj_lib_init_table,lj_lib_cf_table);
  lj_lib_prereg(L,"table.new",luaopen_table_new,(GCtab *)(L->top[-1].u64 & 0x7fffffffffff));
  lj_lib_prereg(L,"table.clone",luaopen_table_clone,(GCtab *)(L->top[-1].u64 & 0x7fffffffffff));
  lj_lib_prereg(L,"table.isarray",luaopen_table_isarray,(GCtab *)(L->top[-1].u64 & 0x7fffffffffff));
  lj_lib_prereg(L,"table.nkeys",luaopen_table_nkeys,(GCtab *)(L->top[-1].u64 & 0x7fffffffffff));
  lj_lib_prereg(L,"table.isempty",luaopen_table_isempty,(GCtab *)(L->top[-1].u64 & 0x7fffffffffff));
  lj_lib_prereg(L,"table.clear",luaopen_table_clear,(GCtab *)(L->top[-1].u64 & 0x7fffffffffff));
  return 1;
}

Assistant:

LUALIB_API int luaopen_table(lua_State *L)
{
  LJ_LIB_REG(L, LUA_TABLIBNAME, table);
#if LJ_52
  lua_getglobal(L, "unpack");
  lua_setfield(L, -2, "unpack");
#endif
  lj_lib_prereg(L, LUA_TABLIBNAME ".new", luaopen_table_new, tabV(L->top-1));
  lj_lib_prereg(L, LUA_TABLIBNAME ".clone", luaopen_table_clone, tabV(L->top-1));
  lj_lib_prereg(L, LUA_TABLIBNAME ".isarray", luaopen_table_isarray, tabV(L->top-1));
  lj_lib_prereg(L, LUA_TABLIBNAME ".nkeys", luaopen_table_nkeys, tabV(L->top-1));
  lj_lib_prereg(L, LUA_TABLIBNAME ".isempty", luaopen_table_isempty, tabV(L->top-1));
  lj_lib_prereg(L, LUA_TABLIBNAME ".clear", luaopen_table_clear, tabV(L->top-1));
  return 1;
}